

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_codec.c
# Opt level: O0

int constructConnPayload
              (BUFFER_HANDLE ctrlPacket,MQTT_CLIENT_OPTIONS *mqttOptions,STRING_HANDLE trace_log)

{
  int iVar1;
  char *pcVar2;
  size_t local_88;
  STRING_HANDLE local_80;
  STRING_HANDLE connect_payload_trace;
  uint8_t *iterator;
  uint8_t *packet;
  size_t totalLen;
  size_t currLen;
  size_t spaceLen;
  size_t willTopicLen;
  size_t willMessageLen;
  size_t passwordLen;
  size_t usernameLen;
  size_t clientLen;
  STRING_HANDLE pSStack_20;
  int result;
  STRING_HANDLE trace_log_local;
  MQTT_CLIENT_OPTIONS *mqttOptions_local;
  BUFFER_HANDLE ctrlPacket_local;
  
  clientLen._4_4_ = 0;
  usernameLen = 0;
  passwordLen = 0;
  willMessageLen = 0;
  willTopicLen = 0;
  spaceLen = 0;
  currLen = 0;
  totalLen = 0;
  packet = (uint8_t *)0x0;
  pSStack_20 = trace_log;
  trace_log_local = (STRING_HANDLE)mqttOptions;
  mqttOptions_local = (MQTT_CLIENT_OPTIONS *)ctrlPacket;
  if (mqttOptions->clientId != (char *)0x0) {
    currLen = 2;
    usernameLen = strlen(mqttOptions->clientId);
  }
  if (trace_log_local[3].s != (char *)0x0) {
    currLen = currLen + 2;
    passwordLen = strlen(trace_log_local[3].s);
  }
  if (trace_log_local[4].s != (char *)0x0) {
    currLen = currLen + 2;
    willMessageLen = strlen(trace_log_local[4].s);
  }
  if (trace_log_local[2].s != (char *)0x0) {
    currLen = currLen + 2;
    willTopicLen = strlen(trace_log_local[2].s);
  }
  if (trace_log_local[1].s != (char *)0x0) {
    currLen = currLen + 2;
    spaceLen = strlen(trace_log_local[1].s);
  }
  if (mqttOptions_local == (MQTT_CLIENT_OPTIONS *)0x0) {
    local_88 = 0;
  }
  else {
    local_88 = BUFFER_length((BUFFER_HANDLE)mqttOptions_local);
  }
  totalLen = local_88;
  packet = (uint8_t *)
           (usernameLen + passwordLen + willMessageLen + willTopicLen + spaceLen + currLen);
  if (mqttOptions_local == (MQTT_CLIENT_OPTIONS *)0x0) {
    clientLen._4_4_ = 0x1a6;
  }
  else if (usernameLen < 0x10000) {
    if ((passwordLen == 0) && (willMessageLen != 0)) {
      clientLen._4_4_ = 0x1af;
    }
    else if (((willTopicLen == 0) || (spaceLen != 0)) && ((spaceLen == 0 || (willTopicLen != 0)))) {
      iVar1 = BUFFER_enlarge((BUFFER_HANDLE)mqttOptions_local,(size_t)packet);
      if (iVar1 == 0) {
        iterator = BUFFER_u_char((BUFFER_HANDLE)mqttOptions_local);
        connect_payload_trace = (STRING_HANDLE)(iterator + totalLen);
        byteutil_writeUTF((uint8_t **)&connect_payload_trace,trace_log_local->s,
                          (uint16_t)usernameLen);
        if ((((willTopicLen < 0x10000) && (spaceLen < 0x10000)) && (passwordLen < 0x10000)) &&
           (willMessageLen < 0x10000)) {
          local_80 = (STRING_HANDLE)0x0;
          if (pSStack_20 != (STRING_HANDLE)0x0) {
            local_80 = STRING_new();
          }
          if ((willTopicLen != 0) && (spaceLen != 0)) {
            if (pSStack_20 != (STRING_HANDLE)0x0) {
              STRING_sprintf(local_80," | WILL_TOPIC: %s",trace_log_local[1].s);
            }
            iterator[7] = iterator[7] | 4;
            byteutil_writeUTF((uint8_t **)&connect_payload_trace,trace_log_local[1].s,
                              (uint16_t)spaceLen);
            iterator[7] = iterator[7] | (byte)(*(int *)((long)&trace_log_local[5].s + 4) << 3);
            if (((ulong)trace_log_local[5].s & 0x10000) != 0) {
              iterator[7] = iterator[7] | 0x20;
            }
            byteutil_writeUTF((uint8_t **)&connect_payload_trace,trace_log_local[2].s,
                              (uint16_t)willTopicLen);
          }
          if (passwordLen != 0) {
            iterator[7] = iterator[7] | 0x80;
            byteutil_writeUTF((uint8_t **)&connect_payload_trace,trace_log_local[3].s,
                              (uint16_t)passwordLen);
            if (pSStack_20 != (STRING_HANDLE)0x0) {
              STRING_sprintf(local_80," | USERNAME: %s",trace_log_local[3].s);
            }
          }
          if (willMessageLen != 0) {
            iterator[7] = iterator[7] | 0x40;
            byteutil_writeUTF((uint8_t **)&connect_payload_trace,trace_log_local[4].s,
                              (uint16_t)willMessageLen);
            if (pSStack_20 != (STRING_HANDLE)0x0) {
              STRING_sprintf(local_80," | PWD: XXXX");
            }
          }
          if (pSStack_20 != (STRING_HANDLE)0x0) {
            pcVar2 = "0";
            if (((ulong)trace_log_local[5].s & 0x1000000) != 0) {
              pcVar2 = "1";
            }
            STRING_sprintf(local_80," | CLEAN: %s",pcVar2);
          }
          if (((ulong)trace_log_local[5].s & 0x1000000) != 0) {
            iterator[7] = iterator[7] | 2;
          }
          if (pSStack_20 != (STRING_HANDLE)0x0) {
            STRING_sprintf(pSStack_20," %lu",(ulong)iterator[7]);
            STRING_concat_with_STRING(pSStack_20,local_80);
            STRING_delete(local_80);
          }
          clientLen._4_4_ = 0;
        }
        else {
          clientLen._4_4_ = 0x1c4;
        }
      }
      else {
        clientLen._4_4_ = 0x1b7;
      }
    }
    else {
      clientLen._4_4_ = 0x1b3;
    }
  }
  else {
    clientLen._4_4_ = 0x1ab;
  }
  return clientLen._4_4_;
}

Assistant:

static int constructConnPayload(BUFFER_HANDLE ctrlPacket, const MQTT_CLIENT_OPTIONS* mqttOptions, STRING_HANDLE trace_log)
{
    int result = 0;
    size_t clientLen = 0;
    size_t usernameLen = 0;
    size_t passwordLen = 0;
    size_t willMessageLen = 0;
    size_t willTopicLen = 0;
    size_t spaceLen = 0;
    size_t currLen = 0;
    size_t totalLen = 0;

    if (mqttOptions->clientId != NULL)
    {
        spaceLen += 2;
        clientLen = strlen(mqttOptions->clientId);
    }
    if (mqttOptions->username != NULL)
    {
        spaceLen += 2;
        usernameLen = strlen(mqttOptions->username);
    }
    if (mqttOptions->password != NULL)
    {
        spaceLen += 2;
        passwordLen = strlen(mqttOptions->password);
    }
    if (mqttOptions->willMessage != NULL)
    {
        spaceLen += 2;
        willMessageLen = strlen(mqttOptions->willMessage);
    }
    if (mqttOptions->willTopic != NULL)
    {
        spaceLen += 2;
        willTopicLen = strlen(mqttOptions->willTopic);
    }

    currLen = ctrlPacket == NULL ? 0 : BUFFER_length(ctrlPacket);
    totalLen = clientLen + usernameLen + passwordLen + willMessageLen + willTopicLen + spaceLen;

    if (ctrlPacket == NULL)
    {
        result = MU_FAILURE;
    }
    // Validate the Username & Password
    else if (clientLen > USHRT_MAX)
    {
        result = MU_FAILURE;
    }
    else if (usernameLen == 0 && passwordLen > 0)
    {
        result = MU_FAILURE;
    }
    else if ((willMessageLen > 0 && willTopicLen == 0) || (willTopicLen > 0 && willMessageLen == 0))
    {
        result = MU_FAILURE;
    }
    else if (BUFFER_enlarge(ctrlPacket, totalLen) != 0)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint8_t* packet = BUFFER_u_char(ctrlPacket);
        uint8_t* iterator = packet;

        iterator += currLen;
        byteutil_writeUTF(&iterator, mqttOptions->clientId, (uint16_t)clientLen);

        // TODO: Read on the Will Topic
        if (willMessageLen > USHRT_MAX || willTopicLen > USHRT_MAX || usernameLen > USHRT_MAX || passwordLen > USHRT_MAX)
        {
            result = MU_FAILURE;
        }
        else
        {
            STRING_HANDLE connect_payload_trace = NULL;
            if (trace_log != NULL)
            {
                connect_payload_trace = STRING_new();
            }
            if (willMessageLen > 0 && willTopicLen > 0)
            {
                if (trace_log != NULL)
                {
                    (void)STRING_sprintf(connect_payload_trace, " | WILL_TOPIC: %s", mqttOptions->willTopic);
                }
                packet[CONN_FLAG_BYTE_OFFSET] |= WILL_FLAG_FLAG;
                byteutil_writeUTF(&iterator, mqttOptions->willTopic, (uint16_t)willTopicLen);
                packet[CONN_FLAG_BYTE_OFFSET] |= (mqttOptions->qualityOfServiceValue << 3);
                if (mqttOptions->messageRetain)
                {
                    packet[CONN_FLAG_BYTE_OFFSET] |= WILL_RETAIN_FLAG;
                }
                byteutil_writeUTF(&iterator, mqttOptions->willMessage, (uint16_t)willMessageLen);
            }
            if (usernameLen > 0)
            {
                packet[CONN_FLAG_BYTE_OFFSET] |= USERNAME_FLAG;
                byteutil_writeUTF(&iterator, mqttOptions->username, (uint16_t)usernameLen);
                if (trace_log != NULL)
                {
                    (void)STRING_sprintf(connect_payload_trace, " | USERNAME: %s", mqttOptions->username);
                }
            }
            if (passwordLen > 0)
            {
                packet[CONN_FLAG_BYTE_OFFSET] |= PASSWORD_FLAG;
                byteutil_writeUTF(&iterator, mqttOptions->password, (uint16_t)passwordLen);
                if (trace_log != NULL)
                {
                    (void)STRING_sprintf(connect_payload_trace, " | PWD: XXXX");
                }
            }
            // TODO: Get the rest of the flags
            if (trace_log != NULL)
            {
                (void)STRING_sprintf(connect_payload_trace, " | CLEAN: %s", mqttOptions->useCleanSession ? "1" : "0");
            }
            if (mqttOptions->useCleanSession)
            {
                packet[CONN_FLAG_BYTE_OFFSET] |= CLEAN_SESSION_FLAG;
            }
            if (trace_log != NULL)
            {
                (void)STRING_sprintf(trace_log, " %lu", packet[CONN_FLAG_BYTE_OFFSET]);
                (void)STRING_concat_with_STRING(trace_log, connect_payload_trace);
                STRING_delete(connect_payload_trace);
            }
            result = 0;
        }
    }
    return result;
}